

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid)

{
  REF_INT RVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL ref_cell;
  REF_DBL *pRVar4;
  REF_INT *pRVar5;
  uint uVar6;
  REF_DBL *original;
  ulong uVar7;
  REF_INT *sorted_index;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  REF_EDGE pRVar12;
  REF_STATUS RVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  double dVar22;
  REF_DBL e1 [3];
  REF_INT ntri;
  REF_INT tri_list [2];
  REF_EDGE ref_edge;
  long local_c0;
  long local_b8;
  REF_GRID local_b0;
  REF_DBL e0 [3];
  
  pRVar3 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar6 = ref_edge_create(&ref_edge,ref_grid);
  pRVar12 = ref_edge;
  if (uVar6 == 0) {
    uVar19 = (ulong)ref_edge->n;
    if ((long)uVar19 < 0) {
      pcVar18 = "malloc dots of REF_DBL negative";
      uVar10 = 0x168;
LAB_001de9b4:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar10,"ref_layer_quad_right_triangles",pcVar18);
      return 1;
    }
    local_b0 = ref_grid;
    original = (REF_DBL *)malloc(uVar19 * 8);
    RVar13 = 2;
    if (original == (REF_DBL *)0x0) {
      pcVar18 = "malloc dots of REF_DBL NULL";
      uVar10 = 0x168;
    }
    else {
      for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
        original[uVar7] = 2.0;
      }
      sorted_index = (REF_INT *)malloc(uVar19 << 2);
      if (sorted_index != (REF_INT *)0x0) {
        for (lVar9 = 0; lVar9 < (int)uVar19; lVar9 = lVar9 + 1) {
          RVar1 = pRVar12->e2n[lVar9 * 2];
          iVar2 = pRVar12->e2n[lVar9 * 2 + 1];
          uVar6 = ref_cell_list_with2(ref_cell,RVar1,iVar2,2,&ntri,tri_list);
          if (uVar6 != 0) {
            uVar19 = (ulong)uVar6;
            pcVar18 = "tri with2";
            uVar10 = 0x170;
            goto LAB_001de4fb;
          }
          if (ntri == 2) {
            iVar15 = ref_cell->node_per;
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            iVar8 = -1;
            for (lVar14 = 0; iVar15 != (int)lVar14; lVar14 = lVar14 + 1) {
              iVar11 = ref_cell->c2n[(long)ref_cell->size_per * (long)tri_list[0] + lVar14];
              iVar17 = iVar11;
              if (iVar11 == iVar2) {
                iVar17 = iVar8;
              }
              if (iVar11 != RVar1) {
                iVar8 = iVar17;
              }
            }
            if (iVar8 == -1) {
              pcVar18 = "n2 not found";
              uVar10 = 0x17c;
              goto LAB_001de9b4;
            }
            iVar11 = -1;
            for (lVar14 = 0; iVar15 != (int)lVar14; lVar14 = lVar14 + 1) {
              iVar17 = ref_cell->c2n[(long)ref_cell->size_per * (long)tri_list[1] + lVar14];
              iVar16 = iVar17;
              if (iVar17 == iVar2) {
                iVar16 = iVar11;
              }
              if (iVar17 != RVar1) {
                iVar11 = iVar16;
              }
            }
            if (iVar11 == -1) {
              pcVar18 = "n3 not found";
              uVar10 = 0x185;
              goto LAB_001de9b4;
            }
            pRVar4 = pRVar3->real;
            local_c0 = (long)(iVar8 * 0xf);
            lVar20 = (long)(RVar1 * 0xf);
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e0[lVar14] = pRVar4[lVar20 + lVar14] - pRVar4[local_c0 + lVar14];
            }
            local_b8 = (long)(iVar2 * 0xf);
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e1[lVar14] = pRVar4[local_b8 + lVar14] - pRVar4[local_c0 + lVar14];
            }
            uVar6 = ref_math_normalize(e0);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e0";
              uVar10 = 0x18b;
              goto LAB_001de4fb;
            }
            uVar6 = ref_math_normalize(e1);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e1";
              uVar10 = 0x18c;
              goto LAB_001de4fb;
            }
            dVar22 = (double)CONCAT44(e0[2]._4_4_,e0[2]._0_4_) * e1[2] +
                     (double)CONCAT44(e0[0]._4_4_,e0[0]._0_4_) *
                     (double)CONCAT44(e1[0]._4_4_,e1[0]._0_4_) +
                     (double)CONCAT44(e0[1]._4_4_,e0[1]._0_4_) * e1[1];
            if (dVar22 <= -dVar22) {
              dVar22 = -dVar22;
            }
            original[lVar9] = dVar22;
            pRVar4 = pRVar3->real;
            lVar21 = (long)(iVar11 * 0xf);
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e0[lVar14] = pRVar4[lVar20 + lVar14] - pRVar4[lVar21 + lVar14];
            }
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e1[lVar14] = pRVar4[local_b8 + lVar14] - pRVar4[lVar21 + lVar14];
            }
            uVar6 = ref_math_normalize(e0);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e0";
              uVar10 = 0x193;
              goto LAB_001de4fb;
            }
            uVar6 = ref_math_normalize(e1);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e1";
              uVar10 = 0x194;
              goto LAB_001de4fb;
            }
            dVar22 = (double)CONCAT44(e0[2]._4_4_,e0[2]._0_4_) * e1[2] +
                     (double)CONCAT44(e0[0]._4_4_,e0[0]._0_4_) *
                     (double)CONCAT44(e1[0]._4_4_,e1[0]._0_4_) +
                     (double)CONCAT44(e0[1]._4_4_,e0[1]._0_4_) * e1[1];
            if (dVar22 <= -dVar22) {
              dVar22 = -dVar22;
            }
            if (dVar22 <= original[lVar9]) {
              dVar22 = original[lVar9];
            }
            original[lVar9] = dVar22;
            pRVar4 = pRVar3->real;
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e0[lVar14] = pRVar4[local_c0 + lVar14] - pRVar4[lVar20 + lVar14];
            }
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e1[lVar14] = pRVar4[lVar21 + lVar14] - pRVar4[lVar20 + lVar14];
            }
            uVar6 = ref_math_normalize(e0);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e0";
              uVar10 = 0x19b;
              goto LAB_001de4fb;
            }
            uVar6 = ref_math_normalize(e1);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e1";
              uVar10 = 0x19c;
              goto LAB_001de4fb;
            }
            dVar22 = (double)CONCAT44(e0[2]._4_4_,e0[2]._0_4_) * e1[2] +
                     (double)CONCAT44(e0[0]._4_4_,e0[0]._0_4_) *
                     (double)CONCAT44(e1[0]._4_4_,e1[0]._0_4_) +
                     (double)CONCAT44(e0[1]._4_4_,e0[1]._0_4_) * e1[1];
            if (dVar22 <= -dVar22) {
              dVar22 = -dVar22;
            }
            if (dVar22 <= original[lVar9]) {
              dVar22 = original[lVar9];
            }
            original[lVar9] = dVar22;
            pRVar4 = pRVar3->real;
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e0[lVar14] = pRVar4[local_c0 + lVar14] - pRVar4[local_b8 + lVar14];
            }
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              e1[lVar14] = pRVar4[lVar21 + lVar14] - pRVar4[local_b8 + lVar14];
            }
            uVar6 = ref_math_normalize(e0);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e0";
              uVar10 = 0x1a3;
              goto LAB_001de4fb;
            }
            uVar6 = ref_math_normalize(e1);
            if (uVar6 != 0) {
              uVar19 = (ulong)uVar6;
              pcVar18 = "norm e1";
              uVar10 = 0x1a4;
              goto LAB_001de4fb;
            }
            dVar22 = (double)CONCAT44(e0[2]._4_4_,e0[2]._0_4_) * e1[2] +
                     (double)CONCAT44(e0[0]._4_4_,e0[0]._0_4_) *
                     (double)CONCAT44(e1[0]._4_4_,e1[0]._0_4_) +
                     (double)CONCAT44(e0[1]._4_4_,e0[1]._0_4_) * e1[1];
            if (dVar22 <= -dVar22) {
              dVar22 = -dVar22;
            }
            if (dVar22 <= original[lVar9]) {
              dVar22 = original[lVar9];
            }
            original[lVar9] = dVar22;
          }
          uVar19 = (ulong)(uint)ref_edge->n;
          pRVar12 = ref_edge;
        }
        uVar6 = ref_sort_heap_dbl((int)uVar19,original,sorted_index);
        if (uVar6 == 0) {
          for (lVar9 = 0; lVar9 < ref_edge->n; lVar9 = lVar9 + 1) {
            iVar2 = sorted_index[lVar9];
            if (original[iVar2] <= 0.1736 && original[iVar2] != 0.1736) {
              RVar1 = ref_edge->e2n[(long)iVar2 * 2];
              iVar2 = ref_edge->e2n[iVar2 * 2 + 1];
              uVar6 = ref_cell_list_with2(ref_cell,RVar1,iVar2,2,tri_list,(REF_INT *)e1);
              if (uVar6 != 0) {
                uVar19 = (ulong)uVar6;
                pcVar18 = "tri with2";
                uVar10 = 0x1b2;
                goto LAB_001de4fb;
              }
              if (tri_list[0] == 2) {
                iVar15 = ref_cell->node_per;
                if (ref_cell->node_per < 1) {
                  iVar15 = 0;
                }
                uVar19 = 0xffffffffffffffff;
                iVar8 = -1;
                for (uVar7 = 0; iVar15 != (int)uVar7; uVar7 = uVar7 + 1) {
                  iVar11 = ref_cell->c2n[(long)ref_cell->size_per * (long)e1[0]._0_4_ + uVar7];
                  if (iVar11 != iVar2 && iVar11 != RVar1) {
                    uVar19 = uVar7;
                    iVar8 = iVar11;
                  }
                  uVar19 = uVar19 & 0xffffffff;
                }
                if (iVar8 == -1) {
                  pcVar18 = "n2 not found";
                  uVar10 = 0x1c0;
                  goto LAB_001de9b4;
                }
                iVar8 = (int)uVar19;
                if (iVar8 == -1) {
                  pcVar18 = "tn not found";
                  uVar10 = 0x1c1;
                  goto LAB_001de9b4;
                }
                iVar11 = -1;
                for (lVar14 = 0; iVar15 != (int)lVar14; lVar14 = lVar14 + 1) {
                  iVar17 = ref_cell->c2n[(long)ref_cell->size_per * (long)e1[0]._4_4_ + lVar14];
                  iVar16 = iVar17;
                  if (iVar17 == iVar2) {
                    iVar16 = iVar11;
                  }
                  if (iVar17 != RVar1) {
                    iVar11 = iVar16;
                  }
                }
                if (iVar11 == -1) {
                  pcVar18 = "n3 not found";
                  uVar10 = 0x1ca;
                  goto LAB_001de9b4;
                }
                iVar2 = (uint)(iVar8 < 1) * 3;
                iVar17 = iVar8 + iVar2 + -1;
                pRVar5 = ref_cell->c2n;
                lVar14 = (long)ref_cell->size_per * (long)e1[0]._0_4_;
                iVar15 = (int)lVar14;
                e0[0]._0_4_ = pRVar5[iVar15 + iVar2 + iVar8 + -1];
                iVar2 = (uint)(iVar17 < 2) * 3;
                iVar15 = iVar15 + -2 + iVar2 + iVar17;
                e0[0]._4_4_ = pRVar5[iVar15];
                e0[1]._0_4_ = pRVar5[(int)((uint)(iVar2 + -2 + iVar17 < 2) * 3 + -2 + iVar15)];
                e0[2]._0_4_ = pRVar5[lVar14 + 3];
                e0[1]._4_4_ = iVar11;
                uVar6 = ref_cell_add(local_b0->cell[6],(REF_INT *)e0,&ntri);
                if (uVar6 != 0) {
                  uVar19 = (ulong)uVar6;
                  pcVar18 = "add";
                  uVar10 = 0x1d7;
                  goto LAB_001de4fb;
                }
                uVar6 = ref_cell_remove(ref_cell,e1[0]._0_4_);
                if (uVar6 != 0) {
                  uVar19 = (ulong)uVar6;
                  pcVar18 = "remove tri 0";
                  uVar10 = 0x1d8;
                  goto LAB_001de4fb;
                }
                uVar6 = ref_cell_remove(ref_cell,e1[0]._4_4_);
                if (uVar6 != 0) {
                  uVar19 = (ulong)uVar6;
                  pcVar18 = "remove tri 1";
                  uVar10 = 0x1d9;
                  goto LAB_001de4fb;
                }
              }
            }
          }
          free(sorted_index);
          free(original);
          uVar6 = ref_edge_free(ref_edge);
          if (uVar6 == 0) {
            return 0;
          }
          uVar19 = (ulong)uVar6;
          pcVar18 = "free edge";
          uVar10 = 0x1df;
        }
        else {
          uVar19 = (ulong)uVar6;
          pcVar18 = "sort dots";
          uVar10 = 0x1a8;
        }
        goto LAB_001de4fb;
      }
      pcVar18 = "malloc order of REF_INT NULL";
      uVar10 = 0x169;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar10,
           "ref_layer_quad_right_triangles",pcVar18);
  }
  else {
    uVar19 = (ulong)uVar6;
    pcVar18 = "orig edges";
    uVar10 = 0x167;
LAB_001de4fb:
    RVar13 = (REF_STATUS)uVar19;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar10,
           "ref_layer_quad_right_triangles",uVar19,pcVar18);
  }
  return RVar13;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *dots;
  REF_INT edge, *order, o;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  ref_malloc_init(dots, ref_edge_n(ref_edge), REF_DBL, 2.0);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    n0 = ref_edge_e2n(ref_edge, 0, edge);
    n1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
    if (2 == ntri) {
      REF_INT t, cell_node, n2, n3, i;
      REF_DBL e0[3], e1[3];
      t = tri_list[0];
      n2 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n2 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n2, "n2 not found");
      t = tri_list[1];
      n3 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n3 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n3, "n3 not found");
      /* n2 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n2);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n2);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = ABS(ref_math_dot(e0, e1));
      /* n3 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n3);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n3);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n0 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n0);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n0);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n1 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n1);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n1);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
    }
  }
  RSS(ref_sort_heap_dbl(ref_edge_n(ref_edge), dots, order), "sort dots");

  for (o = 0; o < ref_edge_n(ref_edge); o++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    edge = order[o];
    if (dots[edge] < 0.1736) { /* sin(10 degrees) */
      n0 = ref_edge_e2n(ref_edge, 0, edge);
      n1 = ref_edge_e2n(ref_edge, 1, edge);

      RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
      if (2 == ntri) {
        REF_INT t, cell_node, n2, n3, tn, new_cell;
        REF_INT nodes[REF_CELL_MAX_NODE_PER];
        t = tri_list[0];
        n2 = REF_EMPTY;
        tn = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n2 = ref_cell_c2n(tri, cell_node, t);
            tn = cell_node;
          }
        }
        RAS(REF_EMPTY != n2, "n2 not found");
        RAS(REF_EMPTY != tn, "tn not found")
        t = tri_list[1];
        n3 = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n3 = ref_cell_c2n(tri, cell_node, t);
          }
        }
        RAS(REF_EMPTY != n3, "n3 not found");
        tn--;
        if (tn < 0) tn += 3;
        t = tri_list[0];
        nodes[0] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[1] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[2] = ref_cell_c2n(tri, tn, t);
        nodes[3] = n3;
        nodes[4] = ref_cell_c2n(tri, 3, t);
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "add");
        RSS(ref_cell_remove(tri, tri_list[0]), "remove tri 0");
        RSS(ref_cell_remove(tri, tri_list[1]), "remove tri 1");
      }
    }
  }
  ref_free(order);
  ref_free(dots);
  RSS(ref_edge_free(ref_edge), "free edge");
  return REF_SUCCESS;
}